

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O3

Integer ma_table_allocate(TableData data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Integer IVar4;
  Integer IVar5;
  Table pTVar6;
  Table __dest;
  long lVar7;
  TableEntryState *pTVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  IVar5 = ma_table_capacity;
  IVar4 = ma_table_entries;
  if (ma_table_capacity <= ma_table_entries) {
    lVar9 = 0x20;
    if (ma_table_capacity != 0) {
      lVar9 = ma_table_capacity * 2;
    }
    uVar10 = (ulong)(uint)((int)lVar9 << 4);
    __dest = (Table)malloc(uVar10);
    pTVar6 = ma_table;
    if (__dest == (Table)0x0) {
      sprintf(ma_ebuf,"could not allocate %u bytes for ma_table",uVar10);
      goto LAB_00157f8d;
    }
    if (0 < IVar5) {
      memcpy(__dest,ma_table,(long)((int)IVar5 << 4));
      free(pTVar6);
    }
    auVar3 = _DAT_001b0620;
    auVar2 = _DAT_001b0200;
    auVar1 = _DAT_001b01f0;
    lVar11 = lVar9 - IVar5;
    if (lVar11 != 0 && IVar5 <= lVar9) {
      lVar7 = lVar11 + -1;
      auVar12._8_4_ = (int)lVar7;
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
      pTVar8 = &__dest[lVar9 + -1].state;
      uVar10 = 0;
      auVar12 = auVar12 ^ _DAT_001b0620;
      do {
        auVar14._8_4_ = (int)uVar10;
        auVar14._0_8_ = uVar10;
        auVar14._12_4_ = (int)(uVar10 >> 0x20);
        auVar15 = (auVar14 | auVar1) ^ auVar3;
        iVar13 = auVar12._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                    iVar13 < auVar15._4_4_) & 1)) {
          *pTVar8 = TES_Unused;
        }
        if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
            auVar15._12_4_ <= auVar12._12_4_) {
          pTVar8[-4] = 0;
        }
        auVar14 = (auVar14 | auVar2) ^ auVar3;
        iVar16 = auVar14._4_4_;
        if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
          pTVar8[-8] = 0;
          pTVar8[-0xc] = 0;
        }
        uVar10 = uVar10 + 4;
        pTVar8 = pTVar8 + -0x10;
      } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar10);
    }
    ma_table_next_slot = IVar5;
    ma_table_capacity = lVar9;
    ma_table = __dest;
  }
  pTVar6 = ma_table;
  IVar5 = ma_table_capacity;
  lVar9 = ma_table_next_slot;
  lVar11 = ma_table_capacity;
  if (0 < ma_table_capacity) {
    do {
      if (ma_table[lVar9].state != TES_Allocated) {
        ma_table[lVar9].data = data;
        pTVar6[lVar9].state = TES_Allocated;
        ma_table_entries = IVar4 + 1;
        ma_table_next_slot = (lVar9 + 1) % IVar5;
        return lVar9;
      }
      lVar11 = lVar11 + -1;
      lVar9 = (lVar9 + 1) % ma_table_capacity;
    } while (lVar11 != 0);
  }
  sprintf(ma_ebuf,"no ma_table slot available, %ld/%ld slots used",IVar4,ma_table_capacity);
LAB_00157f8d:
  ma_error(EL_Nonfatal,ET_Internal,"ma_table_allocate",ma_ebuf);
  return -1;
}

Assistant:

public Integer ma_table_allocate(data)
    TableData    data;        /* to store */
{
    Table    new_ma_table;
    Integer    new_ma_table_capacity;
    unsigned    new_ma_table_size;
    Integer    i;
    Integer    slots_examined;

    /* expand the table if necessary */
    if (ma_table_entries >= ma_table_capacity)
    {
        /* increase table capacity */
        if (ma_table_capacity == 0)
            /* set the initial capacity */
            new_ma_table_capacity = DEFAULT_TABLE_ENTRIES;
        else
            /* double the current capacity */
            new_ma_table_capacity = 2 * ma_table_capacity;

        /* allocate space for new table */
        new_ma_table_size = (unsigned)(new_ma_table_capacity * sizeof(TableEntry));
        if ((new_ma_table = (Table)bytealloc(new_ma_table_size)) == (Table)NULL)
        {
            (void)sprintf(ma_ebuf,
                "could not allocate %u bytes for ma_table",
                new_ma_table_size);
            ma_error(EL_Nonfatal, ET_Internal, "ma_table_allocate", ma_ebuf);
            return TABLE_HANDLE_NONE;
        }

        /* copy and free old table */
        if (ma_table_capacity > 0)
        {
            bytecopy(ma_table, new_ma_table, (ma_table_capacity * sizeof(TableEntry)));
            bytefree(ma_table);
        }

        /* initialize new part of new table */
        for (i = new_ma_table_capacity-1; i >= ma_table_capacity; i--)
            new_ma_table[i].state = TES_Unused;

        /* remember the new table */
        ma_table = new_ma_table;
        ma_table_next_slot = ma_table_capacity;
        ma_table_capacity = new_ma_table_capacity;
    }

    /* perform a linear circular search to find the next available slot */
    for (slots_examined = 0, i = ma_table_next_slot;
         slots_examined < ma_table_capacity;
         slots_examined++, i = (i+1) % ma_table_capacity)
    {
        if (ma_table[i].state != TES_Allocated)
        {
            /* store the data */
            ma_table[i].data = data;
            ma_table[i].state = TES_Allocated;

            /* increment ma_table_entries */
            ma_table_entries++;

            /* advance ma_table_next_slot */
            ma_table_next_slot = (i+1) % ma_table_capacity;

            /* return the handle */
            return i;
        }
    }

    /* if we get here, something is wrong */
    (void)sprintf(ma_ebuf,
        "no ma_table slot available, %ld/%ld slots used",
        (long)ma_table_entries, (long)ma_table_capacity);
    ma_error(EL_Nonfatal, ET_Internal, "ma_table_allocate", ma_ebuf);
    return TABLE_HANDLE_NONE;
}